

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zero_copy_stream_impl_lite.cc
# Opt level: O1

void __thiscall
google::protobuf::io::CopyingInputStreamAdaptor::FreeBuffer(CopyingInputStreamAdaptor *this)

{
  uchar *puVar1;
  long lVar2;
  string *psVar3;
  int iVar4;
  undefined1 *puVar5;
  LogMessage aLStack_58 [16];
  LogMessageFatal aLStack_48 [16];
  CopyingInputStreamAdaptor *pCStack_38;
  undefined1 auStack_18 [16];
  
  puVar5 = auStack_18;
  if ((long)this->backup_bytes_ == 0) {
    psVar3 = (string *)0x0;
  }
  else {
    psVar3 = absl::lts_20240722::log_internal::MakeCheckOpString<long,long>
                       ((long)this->backup_bytes_,0,"backup_bytes_ == 0");
  }
  if (psVar3 == (string *)0x0) {
    this->buffer_used_ = 0;
    puVar1 = (this->buffer_)._M_t.
             super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
             super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
             super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl;
    (this->buffer_)._M_t.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>
    ._M_t.super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
    super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl = (uchar *)0x0;
    if (puVar1 != (uchar *)0x0) {
      operator_delete__(puVar1);
      return;
    }
    return;
  }
  FreeBuffer();
  iVar4 = *(int *)(puVar5 + 0x30);
  lVar2 = *(long *)(puVar5 + 0x20);
  pCStack_38 = this;
  if (lVar2 == 0 || iVar4 != 0) {
    absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
              (aLStack_48,
               "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/protobuf-src/src/google/protobuf/io/zero_copy_stream_impl_lite.cc"
               ,0xe5,0x2b,"backup_bytes_ == 0 && buffer_.get() != NULL");
    absl::lts_20240722::log_internal::LogMessage::
    CopyToEncodedBuffer<(absl::lts_20240722::log_internal::LogMessage::StringType)0>
              (aLStack_48,0x2a," BackUp() can only be called after Next().");
    if (lVar2 == 0 || iVar4 != 0) {
      absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(aLStack_48);
    }
  }
  iVar4 = (int)psVar3;
  if (*(int *)(puVar5 + 0x2c) < iVar4) {
    psVar3 = absl::lts_20240722::log_internal::MakeCheckOpString<long,long>
                       ((long)iVar4,(long)*(int *)(puVar5 + 0x2c),"count <= buffer_used_");
  }
  else {
    psVar3 = (string *)0x0;
  }
  if (psVar3 == (string *)0x0) {
    if (iVar4 < 0) {
      psVar3 = absl::lts_20240722::log_internal::MakeCheckOpString<long,long>
                         ((long)iVar4,0,"count >= 0");
    }
    else {
      psVar3 = (string *)0x0;
    }
    if (psVar3 == (string *)0x0) {
      *(int *)(puVar5 + 0x30) = iVar4;
      return;
    }
    absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)aLStack_58,
               "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/protobuf-src/src/google/protobuf/io/zero_copy_stream_impl_lite.cc"
               ,0xea,*(undefined8 *)(psVar3 + 8),*(undefined8 *)psVar3);
    absl::lts_20240722::log_internal::LogMessage::operator<<
              (aLStack_58,(char (*) [42])" Parameter to BackUp() can\'t be negative.");
  }
  else {
    absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)aLStack_58,
               "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/protobuf-src/src/google/protobuf/io/zero_copy_stream_impl_lite.cc"
               ,0xe7,*(undefined8 *)(psVar3 + 8),*(undefined8 *)psVar3);
    absl::lts_20240722::log_internal::LogMessage::operator<<
              (aLStack_58,
               (char (*) [78])
               " Can\'t back up over more bytes than were returned by the last call to Next().");
  }
  absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)aLStack_58)
  ;
}

Assistant:

void CopyingInputStreamAdaptor::FreeBuffer() {
  ABSL_CHECK_EQ(backup_bytes_, 0);
  buffer_used_ = 0;
  buffer_.reset();
}